

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

void __thiscall soul::SourceCodeOperations::clear(SourceCodeOperations *this)

{
  CodeLocation local_28;
  SourceCodeOperations *local_10;
  SourceCodeOperations *this_local;
  
  local_10 = this;
  pool_ptr<soul::AST::Namespace>::reset(&this->topLevelNamespace);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->allModules);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->processors);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->graphs);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->namespaces);
  local_28.sourceCode.object = (SourceCodeText *)0x0;
  local_28.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&local_28);
  CodeLocation::operator=(&this->source,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  AST::Allocator::clear(&this->allocator);
  return;
}

Assistant:

void SourceCodeOperations::clear()
{
    topLevelNamespace.reset();
    allModules.clear();
    processors.clear();
    graphs.clear();
    namespaces.clear();
    source = {};
    allocator.clear();
}